

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_warp.c
# Opt level: O1

int fe_warp_set(melfb_t *mel,char *id_name)

{
  int iVar1;
  char **ppcVar2;
  uint32 uVar3;
  long lVar4;
  
  ppcVar2 = name2id;
  lVar4 = 0;
  do {
    iVar1 = strcmp(id_name,*ppcVar2);
    if (iVar1 == 0) goto LAB_0012f3a9;
    lVar4 = lVar4 + 1;
    ppcVar2 = ppcVar2 + 1;
  } while (lVar4 != 3);
  ppcVar2 = __name2id;
  lVar4 = 0;
  do {
    iVar1 = strcmp(id_name,*ppcVar2);
    if (iVar1 == 0) goto LAB_0012f3a9;
    lVar4 = lVar4 + 1;
    ppcVar2 = ppcVar2 + 1;
  } while (lVar4 != 3);
  fe_warp_set_cold_1();
  iVar1 = -2;
  uVar3 = 0xffffffff;
LAB_0012f3ab:
  mel->warp_id = uVar3;
  return iVar1;
LAB_0012f3a9:
  uVar3 = (uint32)lVar4;
  iVar1 = 0;
  goto LAB_0012f3ab;
}

Assistant:

int
fe_warp_set(melfb_t *mel, const char *id_name)
{
    uint32 i;

    for (i = 0; name2id[i]; i++) {
        if (strcmp(id_name, name2id[i]) == 0) {
            mel->warp_id = i;
            break;
        }
    }

    if (name2id[i] == NULL) {
        for (i = 0; __name2id[i]; i++) {
            if (strcmp(id_name, __name2id[i]) == 0) {
                mel->warp_id = i;
                break;
            }
        }
        if (__name2id[i] == NULL) {
            E_ERROR("Unimplemented warping function %s\n", id_name);
            E_ERROR("Implemented functions are:\n");
            for (i = 0; name2id[i]; i++) {
                fprintf(stderr, "\t%s\n", name2id[i]);
            }
            mel->warp_id = FE_WARP_ID_NONE;

            return FE_START_ERROR;
        }
    }

    return FE_SUCCESS;
}